

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::SetUrl(ScriptContext *this,BSTR bstrUrl)

{
  code *pcVar1;
  bool bVar2;
  UINT UVar3;
  size_t sVar4;
  undefined4 *puVar5;
  char16_t *url;
  UrlRecord *pUVar6;
  
  if (this->url != (char16_t *)0x0) {
    sVar4 = PAL_wcslen(this->url);
    if (sVar4 == 0) goto LAB_006e8f09;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                              ,0x241,"(this->url != nullptr && PAL_wcslen(this->url) == 0)",
                              "this->url != nullptr && wcslen(this->url) == 0");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar5 = 0;
LAB_006e8f09:
  UVar3 = SysStringLen(bstrUrl);
  url = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                  ((Memory *)&this->generalAllocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc
                   ,0,(ulong)(UVar3 + 1));
  sVar4 = (ulong)UVar3 * 2;
  js_memcpy_s(url,sVar4,bstrUrl,sVar4);
  url[UVar3] = L'\0';
  this->url = url;
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,LeakReportFlag);
  if (bVar2) {
    pUVar6 = Memory::LeakReport::LogUrl(url,(this->super_ScriptContextBase).globalObject);
    this->urlRecord = pUVar6;
  }
  return;
}

Assistant:

void ScriptContext::SetUrl(BSTR bstrUrl)
    {
        // Assumption: this method is never called multiple times
        Assert(this->url != nullptr && wcslen(this->url) == 0);

        charcount_t length = SysStringLen(bstrUrl) + 1; // Add 1 for the NULL.

        char16* urlCopy = AnewArray(this->GeneralAllocator(), char16, length);
        js_memcpy_s(urlCopy, (length - 1) * sizeof(char16), bstrUrl, (length - 1) * sizeof(char16));
        urlCopy[length - 1] = _u('\0');

        this->url = urlCopy;
#ifdef LEAK_REPORT
        if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
        {
            this->urlRecord = LeakReport::LogUrl(urlCopy, this->globalObject);
        }
#endif
    }